

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsdeviceintegration.cpp
# Opt level: O0

void __thiscall
QEglFSDeviceIntegration::waitForVSync(QEglFSDeviceIntegration *this,QPlatformSurface *surface)

{
  int iVar1;
  undefined8 in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int arg;
  char *in_stack_ffffffffffffffb8;
  int line;
  QMessageLogger *in_stack_ffffffffffffffd0;
  undefined4 local_c;
  long local_8;
  
  line = (int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((waitForVSync(QPlatformSurface*)::forceSync == '\0') &&
     (iVar1 = __cxa_guard_acquire(&waitForVSync(QPlatformSurface*)::forceSync), iVar1 != 0)) {
    iVar1 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_FORCEVSYNC",(bool *)0x0);
    waitForVSync::forceSync = iVar1 != 0;
    __cxa_guard_release(&waitForVSync(QPlatformSurface*)::forceSync);
  }
  if (((waitForVSync::forceSync & 1U) != 0) && (framebuffer != -1)) {
    local_c = 0;
    iVar1 = ioctl(framebuffer,0x40044620,&local_c);
    if (iVar1 == -1) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffd0,in_RDI,line,in_stack_ffffffffffffffb8);
      QMessageLogger::warning(&stack0xffffffffffffffd0,"Could not wait for vsync.");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSDeviceIntegration::waitForVSync(QPlatformSurface *surface) const
{
    Q_UNUSED(surface);

#if defined(Q_OS_LINUX) && defined(FBIO_WAITFORVSYNC)
    static const bool forceSync = qEnvironmentVariableIntValue("QT_QPA_EGLFS_FORCEVSYNC");
    if (forceSync && framebuffer != -1) {
        int arg = 0;
        if (ioctl(framebuffer, FBIO_WAITFORVSYNC, &arg) == -1)
            qWarning("Could not wait for vsync.");
    }
#endif
}